

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxDantzigPR<double>::selectEnterX(SPxDantzigPR<double> *this)

{
  DataKey *pDVar1;
  SPxId enterId;
  double bestCo;
  double best;
  DataKey local_28;
  double local_20;
  double local_18;
  DataKey local_10;
  
  pDVar1 = &local_28;
  local_28.info = 0;
  local_28.idx = -1;
  local_10 = (DataKey)((ulong)local_10 & 0xffffffff00000000);
  local_20 = -(this->super_SPxPricer<double>).thetolerance;
  local_18 = local_20;
  if (((this->super_SPxPricer<double>).thesolver)->sparsePricingEnter == true) {
    local_28 = (DataKey)selectEnterSparseDim(this,&local_18,(SPxId *)&local_28);
  }
  else {
    local_28 = (DataKey)selectEnterDenseDim(this,&local_18,(SPxId *)&local_28);
  }
  if (((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) {
    local_10 = (DataKey)selectEnterSparseCoDim(this,&local_20,(SPxId *)&local_28);
  }
  else {
    local_10 = (DataKey)selectEnterDenseCoDim(this,&local_20,(SPxId *)&local_28);
  }
  if ((local_28.info == 0) || (local_10.info != 0 && local_18 <= local_20 * 0.8)) {
    pDVar1 = &local_10;
  }
  return (SPxId)*pDVar1;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}